

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall
cppforth::Forth::MoveFileHandle
          (Forth *this,Cell handler,
          shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *fileHandle_,
          string *function,errorCodes ec)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pFVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pFVar3 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pFVar3 == (this->OpenFiles).
                  super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&local_38,function,": wrong file handler access");
      throwMessage(this,&local_38,ec);
      std::__cxx11::string::~string((string *)&local_38);
      uVar4 = __cxa_rethrow();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    if (pFVar3->FILE == handler) break;
    pFVar3 = pFVar3 + 1;
  }
  peVar1 = (pFVar3->fileObject).
           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (pFVar3->fileObject).
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (fileHandle_->
           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  (fileHandle_->
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>)
  ._M_ptr = peVar1;
  p_Var2 = (fileHandle_->
           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (fileHandle_->
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>)
  ._M_refcount._M_pi =
       (pFVar3->fileObject).
       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (pFVar3->fileObject).
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  return;
}

Assistant:

void  MoveFileHandle(Cell handler,std::shared_ptr<std::fstream>& fileHandle_,  const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler) {
			std::swap((*it).fileObject, fileHandle_);
			return;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}